

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

double __thiscall pstore::logger::log(logger *this,double __x)

{
  unsigned_long_long in_RCX;
  czstring in_RDX;
  uint in_ESI;
  double dVar1;
  string sStack_38;
  
  to_string<unsigned_long_long>(&sStack_38,in_RDX,in_RCX);
  (*this->_vptr_logger[2])(this,(ulong)in_ESI,&sStack_38);
  dVar1 = (double)std::__cxx11::string::~string((string *)&sStack_38);
  return dVar1;
}

Assistant:

void logger::log (priority const p, gsl::czstring const message,
                          unsigned long long const d) {
            this->log (p, to_string (message, d));
        }